

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderState.hpp
# Opt level: O2

void __thiscall
rr::RenderState::RenderState
          (RenderState *this,ViewportState *viewport_,ViewportOrientation viewportOrientation_)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  
  this->cullMode = CULLMODE_NONE;
  this->provokingVertexConvention = PROVOKINGVERTEX_LAST;
  (this->rasterization).winding = WINDING_CCW;
  (this->rasterization).horizontalFill = FILL_LEFT;
  (this->rasterization).verticalFill = FILL_BOTTOM;
  (this->rasterization).viewportOrientation = VIEWPORTORIENTATION_LAST;
  FragmentOperationState::FragmentOperationState(&this->fragOps);
  (this->point).pointSize = 1.0;
  iVar1 = (viewport_->rect).bottom;
  iVar2 = (viewport_->rect).width;
  iVar3 = (viewport_->rect).height;
  (this->viewport).rect.left = (viewport_->rect).left;
  (this->viewport).rect.bottom = iVar1;
  (this->viewport).rect.width = iVar2;
  (this->viewport).rect.height = iVar3;
  fVar4 = viewport_->zf;
  (this->viewport).zn = viewport_->zn;
  (this->viewport).zf = fVar4;
  (this->line).lineWidth = 1.0;
  (this->restart).enabled = false;
  (this->restart).restartIndex = 0xffffffff;
  this->viewportOrientation = viewportOrientation_;
  (this->rasterization).viewportOrientation = viewportOrientation_;
  return;
}

Assistant:

explicit RenderState (const ViewportState& viewport_, ViewportOrientation viewportOrientation_ = VIEWPORTORIENTATION_LOWER_LEFT)
		: cullMode					(CULLMODE_NONE)
		, provokingVertexConvention	(PROVOKINGVERTEX_LAST)
		, viewport					(viewport_)
		, viewportOrientation		(viewportOrientation_)
	{
		rasterization.viewportOrientation = viewportOrientation;
	}